

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_utility.cc
# Opt level: O3

string * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::AppendPathSegmentToPrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,StringPiece prefix,
          StringPiece segment)

{
  string *psVar1;
  string *extraout_RAX;
  char *pcVar2;
  AlphaNum local_98;
  _anonymous_namespace_ *local_68;
  char *local_60;
  AlphaNum local_38;
  
  local_98.piece_size_ = (size_t)segment.ptr_;
  local_98.piece_data_ = (char *)prefix.length_;
  local_60 = prefix.ptr_;
  if (local_60 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((AlphaNum *)local_98.piece_data_ != (AlphaNum *)0x0) {
      local_60 = ((AlphaNum *)local_98.piece_data_)->digits +
                 (long)(((AlphaNum *)local_98.piece_size_)->digits + -0x20);
      this = (_anonymous_namespace_ *)local_98.piece_data_;
      pcVar2 = local_60;
      goto LAB_0030bc32;
    }
  }
  else {
    if ((AlphaNum *)local_98.piece_size_ != (AlphaNum *)0x0) {
      local_68 = this;
      if ((1 < (long)local_98.piece_size_) &&
         (*(short *)&((AlphaNum *)local_98.piece_data_)->piece_data_ == 0x225b)) {
        local_38.piece_data_ = local_98.piece_data_;
        local_38.piece_size_ = local_98.piece_size_;
        psVar1 = StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_68,&local_38,
                                   (AlphaNum *)local_98.piece_data_);
        return psVar1;
      }
      local_38.piece_data_ = ".";
      local_38.piece_size_ = 1;
      psVar1 = StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_68,&local_38,&local_98,
                                 (AlphaNum *)local_98.piece_size_);
      return psVar1;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (this != (_anonymous_namespace_ *)0x0) {
      local_60 = local_60 + (long)this;
      pcVar2 = (char *)0x0;
LAB_0030bc32:
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,this,local_60,local_98.piece_data_,pcVar2,
                 segment.length_);
      return extraout_RAX;
    }
  }
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return (string *)&__return_storage_ptr__->field_2;
}

Assistant:

std::string AppendPathSegmentToPrefix(StringPiece prefix,
                                      StringPiece segment) {
  if (prefix.empty()) {
    return std::string(segment);
  }
  if (segment.empty()) {
    return std::string(prefix);
  }
  // If the segment is a map key, appends it to the prefix without the ".".
  if (HasPrefixString(segment, "[\"")) {
    return StrCat(prefix, segment);
  }
  return StrCat(prefix, ".", segment);
}